

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  long *in_RDI;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  int Al;
  int ci;
  int blkn;
  int nbits;
  int temp2;
  int temp;
  huff_entropy_ptr entropy;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  huff_entropy_ptr in_stack_ffffffffffffffc0;
  huff_entropy_ptr entropy_00;
  short *psVar3;
  undefined4 uVar4;
  int iVar5;
  int local_28;
  int local_24;
  int local_1c;
  
  lVar1 = in_RDI[0x46];
  uVar4 = (undefined4)in_RDI[0x3b];
  *(undefined8 *)(lVar1 + 200) = *(undefined8 *)in_RDI[5];
  *(undefined8 *)(lVar1 + 0xd0) = *(undefined8 *)(in_RDI[5] + 8);
  if ((*(int *)((long)in_RDI + 0x13c) != 0) && (*(int *)(lVar1 + 0x38) == 0)) {
    emit_restart_e(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  for (local_28 = 0; local_28 < (int)in_RDI[0x34]; local_28 = local_28 + 1) {
    psVar3 = *(short **)(in_RSI + (long)local_28 * 8);
    iVar5 = *(int *)((long)in_RDI + (long)local_28 * 4 + 0x1a4);
    entropy_00 = (huff_entropy_ptr)in_RDI[(long)iVar5 + 0x2f];
    iVar2 = (int)*psVar3 >> ((byte)uVar4 & 0x1f);
    local_1c = iVar2 - *(int *)(lVar1 + 0x24 + (long)iVar5 * 4);
    *(int *)(lVar1 + 0x24 + (long)iVar5 * 4) = iVar2;
    if (local_1c < 0) {
      local_1c = -local_1c;
    }
    local_24 = 0;
    for (; local_1c != 0; local_1c = local_1c >> 1) {
      local_24 = local_24 + 1;
    }
    if (0xb < local_24) {
      *(undefined4 *)(*in_RDI + 0x28) = 6;
      (**(code **)*in_RDI)(in_RDI);
    }
    emit_dc_symbol(entropy_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    if (local_24 != 0) {
      emit_bits_e((huff_entropy_ptr)CONCAT44(iVar5,uVar4),(uint)((ulong)psVar3 >> 0x20),(int)psVar3)
      ;
    }
  }
  *(undefined8 *)in_RDI[5] = *(undefined8 *)(lVar1 + 200);
  *(undefined8 *)(in_RDI[5] + 8) = *(undefined8 *)(lVar1 + 0xd0);
  if (*(int *)((long)in_RDI + 0x13c) != 0) {
    if (*(int *)(lVar1 + 0x38) == 0) {
      *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)((long)in_RDI + 0x13c);
      *(int *)(lVar1 + 0x3c) = *(int *)(lVar1 + 0x3c) + 1;
      *(uint *)(lVar1 + 0x3c) = *(uint *)(lVar1 + 0x3c) & 7;
    }
    *(int *)(lVar1 + 0x38) = *(int *)(lVar1 + 0x38) + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp, temp2;
  register int nbits;
  int blkn, ci;
  int Al = cinfo->Al;
  JBLOCKROW block;
  jpeg_component_info * compptr;
  ISHIFT_TEMPS

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    temp2 = IRIGHT_SHIFT((int) ((*block)[0]), Al);

    /* DC differences are figured on the point-transformed values. */
    temp = temp2 - entropy->saved.last_dc_val[ci];
    entropy->saved.last_dc_val[ci] = temp2;

    /* Encode the DC coefficient difference per section G.1.2.1 */
    temp2 = temp;
    if (temp < 0) {
      temp = -temp;		/* temp is abs value of input */
      /* For a negative input, want temp2 = bitwise complement of abs(input) */
      /* This code assumes we are on a two's complement machine */
      temp2--;
    }
    
    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = 0;
    while (temp) {
      nbits++;
      temp >>= 1;
    }
    /* Check for out-of-range coefficient values.
     * Since we're encoding a difference, the range limit is twice as much.
     */
    if (nbits > MAX_COEF_BITS+1)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);
    
    /* Count/emit the Huffman-coded symbol for the number of bits */
    emit_dc_symbol(entropy, compptr->dc_tbl_no, nbits);
    
    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    if (nbits)			/* emit_bits rejects calls with size 0 */
      emit_bits_e(entropy, (unsigned int) temp2, nbits);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}